

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_time.c
# Opt level: O1

void mbedtls_ct_memcpy_offset
               (uchar *dest,uchar *src,size_t offset,size_t offset_min,size_t offset_max,size_t len)

{
  size_t offsetval;
  
  if (offset_min <= offset_max) {
    do {
      mbedtls_ct_memcpy_if
                (~((long)(-(offset ^ offset_min) | offset ^ offset_min) >> 0x3f),dest,
                 src + offset_min,(uchar *)0x0,len);
      offset_min = offset_min + 1;
    } while (offset_min <= offset_max);
  }
  return;
}

Assistant:

void mbedtls_ct_memcpy_offset(unsigned char *dest,
                              const unsigned char *src,
                              size_t offset,
                              size_t offset_min,
                              size_t offset_max,
                              size_t len)
{
    size_t offsetval;

    for (offsetval = offset_min; offsetval <= offset_max; offsetval++) {
        mbedtls_ct_memcpy_if(mbedtls_ct_uint_eq(offsetval, offset), dest, src + offsetval, NULL,
                             len);
    }
}